

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Vec_Vec_t * Saig_RefManOrderLiterals(Saig_RefMan_t *p,Vec_Int_t *vVar2PiId,Vec_Int_t *vAssumps)

{
  int Entry;
  int iVar1;
  int i;
  Vec_Vec_t *p_00;
  Vec_Int_t *p_01;
  int i_00;
  
  p_00 = Vec_VecAlloc(100);
  p_01 = Vec_IntStartFull(p->pAig->nTruePis);
  i_00 = 0;
  while( true ) {
    if (vAssumps->nSize <= i_00) {
      Vec_IntFree(p_01);
      return p_00;
    }
    Entry = Vec_IntEntry(vAssumps,i_00);
    iVar1 = Vec_IntEntry(vVar2PiId,Entry >> 1);
    if ((iVar1 < 0) || (p->pFrames->nObjs[2] <= iVar1)) break;
    i = Vec_IntEntry(p->vMapPiF2A,iVar1 * 2);
    Vec_IntEntry(p->vMapPiF2A,iVar1 * 2 + 1);
    iVar1 = Vec_IntEntry(p_01,i);
    if (iVar1 == -1) {
      Vec_IntWriteEntry(p_01,i,p_00->nSize);
    }
    iVar1 = Vec_IntEntry(p_01,i);
    Vec_VecPushInt(p_00,iVar1,Entry);
    i_00 = i_00 + 1;
  }
  __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                ,0x1c1,
                "Vec_Vec_t *Saig_RefManOrderLiterals(Saig_RefMan_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Vec_t * Saig_RefManOrderLiterals( Saig_RefMan_t * p, Vec_Int_t * vVar2PiId, Vec_Int_t * vAssumps )
{
    Vec_Vec_t * vLits;
    Vec_Int_t * vVar2New;
    int i, Entry, iInput, iFrame;
    // collect literals
    vLits = Vec_VecAlloc( 100 );
    vVar2New = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
//        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
        if ( Vec_IntEntry( vVar2New, iInput ) == ~0 )
            Vec_IntWriteEntry( vVar2New, iInput, Vec_VecSize(vLits) );
        Vec_VecPushInt( vLits, Vec_IntEntry( vVar2New, iInput ), Entry );
    }
    Vec_IntFree( vVar2New );
    return vLits;
}